

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::cord_internal::anon_unknown_16::CordRepAnalyzer::AnalyzeBtree
          (CordRepAnalyzer *this,RepRef rep)

{
  size_t *psVar1;
  byte bVar2;
  byte bVar3;
  CordzStatistics *pCVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  CordRep *pCVar8;
  CordRep *pCVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  RepRef rep_00;
  RepRef rep_01;
  
  sVar5 = rep.refcount;
  pCVar8 = rep.rep;
  pCVar4 = this->statistics_;
  psVar1 = &pCVar4->node_count;
  *psVar1 = *psVar1 + 1;
  psVar1 = &(pCVar4->node_counts).btree;
  *psVar1 = *psVar1 + 1;
  (this->memory_usage_).total = (this->memory_usage_).total + 0x40;
  auVar11._8_4_ = rep.refcount._4_4_;
  auVar11._0_8_ = sVar5;
  auVar11._12_4_ = 0x45300000;
  (this->memory_usage_).fair_share =
       64.0 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)rep.refcount) - 4503599627370496.0)) +
       (this->memory_usage_).fair_share;
  if (pCVar8->tag != '\x03') {
    __assert_fail("IsBtree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x25c,"const CordRepBtree *absl::cord_internal::CordRep::btree() const");
  }
  bVar2 = pCVar8->storage[1];
  bVar3 = pCVar8->storage[2];
  if (pCVar8->storage[0] == '\0') {
    if (bVar2 != bVar3) {
      lVar7 = (ulong)bVar2 << 3;
      do {
        pCVar9 = *(CordRep **)(pCVar8[1].storage + lVar7 + -0xd);
        if (pCVar9 == (CordRep *)0x0) {
          pCVar9 = (CordRep *)0x0;
          sVar6 = 0;
        }
        else {
          sVar6 = (long)((pCVar9->refcount).count_.super___atomic_base<int>._M_i >> 1) * sVar5;
        }
        rep_01.refcount = sVar6;
        rep_01.rep = pCVar9;
        CountLinearReps(this,rep_01,&this->memory_usage_);
        lVar7 = lVar7 + 8;
      } while ((ulong)bVar3 * 8 != lVar7);
    }
  }
  else if (bVar2 != bVar3) {
    uVar10 = (ulong)((uint)bVar2 * 8);
    do {
      pCVar9 = *(CordRep **)(pCVar8[1].storage + (uVar10 - 0xd));
      if (pCVar9 == (CordRep *)0x0) {
        pCVar9 = (CordRep *)0x0;
        sVar6 = 0;
      }
      else {
        sVar6 = (long)((pCVar9->refcount).count_.super___atomic_base<int>._M_i >> 1) * sVar5;
      }
      rep_00.refcount = sVar6;
      rep_00.rep = pCVar9;
      AnalyzeBtree(this,rep_00);
      uVar10 = uVar10 + 8;
    } while ((ulong)bVar3 * 8 != uVar10);
  }
  return;
}

Assistant:

void AnalyzeBtree(RepRef rep) {
    statistics_.node_count++;
    statistics_.node_counts.btree++;
    memory_usage_.Add(sizeof(CordRepBtree), rep.refcount);
    const CordRepBtree* tree = rep.rep->btree();
    if (tree->height() > 0) {
      for (CordRep* edge : tree->Edges()) {
        AnalyzeBtree(rep.Child(edge));
      }
    } else {
      for (CordRep* edge : tree->Edges()) {
        CountLinearReps(rep.Child(edge), memory_usage_);
      }
    }
  }